

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

uint32 __thiscall google::anon_unknown_8::LogFileObject::LogSize(LogFileObject *this)

{
  uint32 uVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    uVar1 = this->file_length_;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return uVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

uint32 LogSize() override {
    std::lock_guard<std::mutex> l{mutex_};
    return file_length_;
  }